

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsqlquerymodel.cpp
# Opt level: O0

QVariant * __thiscall QSqlQueryModel::data(QSqlQueryModel *this,QModelIndex *item,int role)

{
  bool bVar1;
  int index;
  int iVar2;
  QSqlQueryModelPrivate *pQVar3;
  uint in_ECX;
  QModelIndex *in_RDX;
  long *in_RSI;
  QVariant *in_RDI;
  long in_FS_OFFSET;
  QSqlQueryModelPrivate *d;
  QModelIndex dItem;
  undefined4 in_stack_ffffffffffffff68;
  int in_stack_ffffffffffffff6c;
  QModelIndex *in_stack_ffffffffffffff70;
  QSqlQueryModelPrivate *in_stack_ffffffffffffff80;
  undefined1 in_stack_ffffffffffffff8b;
  QSqlRecord *this_00;
  QSqlQueryModelPrivate *pQVar4;
  undefined4 in_stack_ffffffffffffffb8;
  QModelIndex local_20;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar3 = d_func((QSqlQueryModel *)0x14fe7b);
  bVar1 = QModelIndex::isValid(in_stack_ffffffffffffff70);
  if (bVar1) {
    if ((in_ECX & 0xfffffffd) == 0) {
      this_00 = &pQVar3->rec;
      QModelIndex::column(in_RDX);
      bVar1 = QSqlRecord::isGenerated
                        ((QSqlRecord *)in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c);
      if (bVar1) {
        local_20.r = -0x55555556;
        local_20.c = -0x55555556;
        local_20.i = 0xaaaaaaaaaaaaaaaa;
        local_20.m.ptr = (QAbstractItemModel *)0xaaaaaaaaaaaaaaaa;
        (**(code **)(*in_RSI + 0x198))(&local_20,in_RSI,in_RDX);
        index = QModelIndex::row(&local_20);
        iVar2 = QModelIndex::row(&pQVar3->bottom);
        pQVar4 = pQVar3;
        if (iVar2 < index) {
          QModelIndex::row(&local_20);
          QSqlQueryModelPrivate::prefetch
                    ((QSqlQueryModelPrivate *)CONCAT44(in_ECX,in_stack_ffffffffffffffb8),
                     (int)((ulong)pQVar4 >> 0x20));
          in_stack_ffffffffffffff80 = pQVar3;
        }
        iVar2 = (int)((ulong)&pQVar4->query >> 0x20);
        QModelIndex::row(&local_20);
        bVar1 = QSqlQuery::seek((QSqlQuery *)this_00,index,(bool)in_stack_ffffffffffffff8b);
        if (bVar1) {
          QModelIndex::column(&local_20);
          QSqlQuery::value((QSqlQuery *)in_stack_ffffffffffffff80,iVar2);
        }
        else {
          QSqlQuery::lastError
                    ((QSqlQuery *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
          QSqlError::operator=
                    ((QSqlError *)in_stack_ffffffffffffff70,
                     (QSqlError *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
          QSqlError::~QSqlError((QSqlError *)0x14ffde);
          QVariant::QVariant((QVariant *)0x14ffe8);
        }
      }
      else {
        QVariant::QVariant((QVariant *)0x14feec);
      }
    }
    else {
      QVariant::QVariant((QVariant *)0x14feb3);
    }
  }
  else {
    QVariant::QVariant((QVariant *)0x14fe98);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QVariant QSqlQueryModel::data(const QModelIndex &item, int role) const
{
    Q_D(const QSqlQueryModel);
    if (!item.isValid())
        return QVariant();

    if (role & ~(Qt::DisplayRole | Qt::EditRole))
        return QVariant();

    if (!d->rec.isGenerated(item.column()))
        return QVariant();
    QModelIndex dItem = indexInQuery(item);
    if (dItem.row() > d->bottom.row())
        const_cast<QSqlQueryModelPrivate *>(d)->prefetch(dItem.row());

    if (!d->query.seek(dItem.row())) {
        d->error = d->query.lastError();
        return QVariant();
    }

    return d->query.value(dItem.column());
}